

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polyline.h
# Opt level: O0

void anurbs::Polyline<2l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  char *name_00;
  class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *pcVar1;
  arg aVar2;
  undefined1 local_128;
  arg local_120;
  arg local_110;
  arg local_100;
  code *local_f0;
  undefined8 local_e8;
  arg local_e0;
  arg local_d0;
  code *local_c0;
  undefined8 local_b8;
  code *local_b0;
  undefined8 local_a8;
  arg local_a0;
  arg local_90;
  constructor<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  local_79;
  arg local_78;
  arg local_68;
  constructor<long> local_55 [13];
  handle local_48;
  class_<anurbs::Polyline<2L>,_std::shared_ptr<anurbs::Polyline<2L>_>_> local_40;
  string local_38 [8];
  string name;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  name.field_2._8_8_ = model;
  python_name_abi_cxx11_();
  local_48.m_ptr = (m->super_object).super_handle.m_ptr;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::Polyline<2L>,_std::shared_ptr<anurbs::Polyline<2L>_>_>::class_<>
            (&local_40,local_48,name_00);
  pybind11::init<long>();
  local_78 = pybind11::literals::operator____a("nb_points",9);
  local_68.name = local_78.name;
  local_68._8_1_ = local_78._8_1_;
  pcVar1 = (class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *)
           pybind11::class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>>::
           def<long,pybind11::arg>
                     ((class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *)
                      &local_40,local_55,&local_68);
  pybind11::
  init<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
            ();
  local_a0 = pybind11::literals::operator____a("points",6);
  local_90.name = local_a0.name;
  local_90._8_1_ = local_a0._8_1_;
  pcVar1 = (class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *)
           pybind11::class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>>::
           def<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>,pybind11::arg>
                     (pcVar1,&local_79,&local_90);
  local_b0 = Polyline<2L>::nb_points;
  local_a8 = 0;
  pcVar1 = (class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *)
           pybind11::class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>>::
           def<long(anurbs::Polyline<2l>::*)()const>
                     (pcVar1,"nb_points",(offset_in_Model_to_subr *)&local_b0);
  local_c0 = Polyline<2L>::point;
  local_b8 = 0;
  local_e0 = pybind11::literals::operator____a("index",5);
  local_d0.name = local_e0.name;
  local_d0._8_1_ = local_e0._8_1_;
  pcVar1 = (class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *)
           pybind11::class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>>::
           def<Eigen::Matrix<double,1,2,1,1,2>(anurbs::Polyline<2l>::*)(unsigned_long)const,pybind11::arg>
                     (pcVar1,"point",(offset_in_Model_to_subr *)&local_c0,&local_d0);
  local_f0 = Polyline<2L>::set_point;
  local_e8 = 0;
  local_110 = pybind11::literals::operator____a("index",5);
  local_100.name = local_110.name;
  local_100._8_1_ = local_110._8_1_;
  aVar2 = pybind11::literals::operator____a("value",5);
  local_120.name = aVar2.name;
  local_128 = aVar2._8_1_;
  local_120._8_1_ = local_128;
  pybind11::class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>>::
  def<void(anurbs::Polyline<2l>::*)(unsigned_long,Eigen::Matrix<double,1,2,1,1,2>const&),pybind11::arg,pybind11::arg>
            (pcVar1,"set_point",(offset_in_Model_to_subr *)&local_f0,&local_100,&local_120);
  pybind11::class_<anurbs::Polyline<2L>,_std::shared_ptr<anurbs::Polyline<2L>_>_>::~class_
            (&local_40);
  Model::register_python_data_type<anurbs::Polyline<2l>>
            (m,(class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)name.field_2._8_8_);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Holder = anurbs::Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            .def(py::init<Index>(), "nb_points"_a)
            .def(py::init<std::vector<Vector>>(), "points"_a)
            .def("nb_points", &Type::nb_points)
            .def("point", &Type::point, "index"_a)
            .def("set_point", &Type::set_point, "index"_a, "value"_a)
        ;

        Model::register_python_data_type<Type>(m, model);
    }